

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::addmessages(worldstate *ws,ucharbuf *wsbuf,int mtu,clientinfo *bi,clientinfo *ci)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uchar *vals;
  int len;
  int offset;
  clientinfo *ci_local;
  clientinfo *bi_local;
  int mtu_local;
  ucharbuf *wsbuf_local;
  worldstate *ws_local;
  
  bVar1 = vector<unsigned_char>::empty(&bi->messages);
  if (!bVar1) {
    iVar2 = databuf<unsigned_char>::length(wsbuf);
    iVar3 = vector<unsigned_char>::length(&bi->messages);
    if (mtu < iVar2 + 10 + iVar3) {
      sendmessages(ws,wsbuf);
    }
    iVar2 = databuf<unsigned_char>::length(wsbuf);
    putint(wsbuf,0x58);
    putint(wsbuf,bi->clientnum);
    iVar3 = vector<unsigned_char>::length(&bi->messages);
    putuint(wsbuf,iVar3);
    vals = vector<unsigned_char>::getbuf(&bi->messages);
    iVar3 = vector<unsigned_char>::length(&bi->messages);
    databuf<unsigned_char>::put(wsbuf,vals,iVar3);
    vector<unsigned_char>::setsize(&bi->messages,0);
    iVar3 = databuf<unsigned_char>::length(wsbuf);
    if (ci->wsdata < wsbuf->buf) {
      ci->wsdata = wsbuf->buf + iVar2;
      ci->wslen = iVar3 - iVar2;
    }
    else {
      ci->wslen = (iVar3 - iVar2) + ci->wslen;
    }
  }
  return;
}

Assistant:

static inline void addmessages(worldstate &ws, ucharbuf &wsbuf, int mtu, clientinfo &bi, clientinfo &ci)
    {
        if(bi.messages.empty()) return;
        if(wsbuf.length() + 10 + bi.messages.length() > mtu) sendmessages(ws, wsbuf);
        int offset = wsbuf.length();
        putint(wsbuf, N_CLIENT);
        putint(wsbuf, bi.clientnum);
        putuint(wsbuf, bi.messages.length());
        wsbuf.put(bi.messages.getbuf(), bi.messages.length());
        bi.messages.setsize(0);
        int len = wsbuf.length() - offset;
        if(ci.wsdata < wsbuf.buf) { ci.wsdata = &wsbuf.buf[offset]; ci.wslen = len; }
        else ci.wslen += len;
    }